

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * __thiscall
spvtools::opt::analysis::TensorViewNV::str_abi_cxx11_
          (string *__return_storage_ptr__,TensorViewNV *this)

{
  pointer puVar1;
  ostream *poVar2;
  pointer puVar3;
  ostringstream oss;
  ostringstream aoStack_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  poVar2 = std::operator<<((ostream *)aoStack_1a8,"<");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,", ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  puVar1 = (this->perm_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (this->perm_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    poVar2 = std::operator<<((ostream *)aoStack_1a8,", ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  std::operator<<((ostream *)aoStack_1a8,">");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string TensorViewNV::str() const {
  std::ostringstream oss;
  oss << "<" << dim_id_ << ", " << has_dimensions_id_;
  for (auto p : perm_) {
    oss << ", " << p;
  }
  oss << ">";
  return oss.str();
}